

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O3

watchpoint_id __thiscall
cmDebugger_impl::SetWatchpoint(cmDebugger_impl *this,string *expr,WatchpointType watchpointType)

{
  watchpoint_id wVar1;
  pointer pcVar2;
  int iVar3;
  long *client_data;
  Watchpoint *__p;
  mapped_type *pmVar4;
  watchpoint_id nextId;
  watchpoint_id local_38;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->breakpointMutex);
  if (iVar3 == 0) {
    wVar1 = this->nextBreakId;
    this->nextBreakId = wVar1 + 1;
    local_38 = wVar1;
    client_data = (long *)operator_new(0x10);
    __p = (Watchpoint *)operator_new(0x40);
    (__p->super_cmWatchpoint).Id = wVar1;
    (__p->super_cmWatchpoint).Type = watchpointType;
    (__p->super_cmWatchpoint).Variable._M_dataplus._M_p =
         (pointer)&(__p->super_cmWatchpoint).Variable.field_2;
    pcVar2 = (expr->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(__p->super_cmWatchpoint).Variable,pcVar2,pcVar2 + expr->_M_string_length)
    ;
    __p->debugger = this;
    __p->user_data = (void *)0x0;
    *client_data = (long)__p;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<cmDebugger_impl::Watchpoint*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(client_data + 1),__p);
    *(long **)(*client_data + 0x38) = client_data;
    pmVar4 = std::
             map<unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>_>_>
             ::operator[](&this->activeWatchpoints,&local_38);
    (pmVar4->super___weak_ptr<cmDebugger_impl::Watchpoint,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)*client_data;
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pmVar4->super___weak_ptr<cmDebugger_impl::Watchpoint,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(client_data + 1));
    cmVariableWatch::AddWatch
              (this->CMakeInstance->VariableWatch,expr,WatchMethodCB,client_data,WatchMethodDelete);
    wVar1 = local_38;
    pthread_mutex_unlock((pthread_mutex_t *)&this->breakpointMutex);
    return wVar1;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

watchpoint_id SetWatchpoint(
    const std::string& expr,
    cmWatchpoint::WatchpointType watchpointType) override
  {
    // The pointer to a smart pointer mechanism isn't pretty, but it should be
    // safe.The idea is that we store away the control block into
    // activeWatchpoints as a weak ptr; and so if the VariableWatch is
    // destroyed first, the weak ptr just goes stale. If the debugger is
    // destroyed first, the weak_ptrs must still be valid, so in the
    // debugger_impl dtor we clear the debugger on all still-valid watchpoints,
    // and the watchpoint callback is a noop if the debugger field isn't set.

    // NOTE: This means we are safe for either order, but is still isn't thread
    // safe -- you can hit a race condition if you delete the cmVariableWatch
    // and the cmDebugger simultaneously in different threads. Since these
    // objects are both dtored in the main thread, this shouldn't be an issue.
    std::lock_guard<std::mutex> l(breakpointMutex);
    watchpoint_id nextId = nextBreakId++;
    auto watch =
      new Watchpoint::ptr(new Watchpoint(this, nextId, watchpointType, expr));

    // Looks odd for sure but we need to store away user_data we hand off to
    // AddWatch so we can remove the watch later on
    (*watch)->user_data = watch;
    activeWatchpoints[nextId] = *watch;

    this->CMakeInstance.GetVariableWatch()->AddWatch(expr, WatchMethodCB,
                                                     watch, WatchMethodDelete);
    return nextId;
  }